

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool dg::pta::PointerAnalysisFSInv::invalidateMemory(PSNode *node,PSNode *pred,bool is_free)

{
  bool bVar1;
  reference ppVar2;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  Pointer *ptr_2;
  const_iterator __end4;
  const_iterator __begin4;
  PointsToSetT *__range4;
  PointsToSetT *S;
  PointsToSetT *predS;
  pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet> *it_1;
  iterator __end3_1;
  iterator __begin3_1;
  MemoryObject *__range3_1;
  Pointer *ptr_1;
  const_iterator __end5;
  const_iterator __begin5;
  PointsToSetT *__range5;
  Pointer *ptr;
  pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet> *it;
  iterator __end3;
  iterator __begin3;
  MemoryObject *__range3;
  MemoryObject *pmo;
  MemoryObject *mo;
  pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>
  *I;
  iterator __end2;
  iterator __begin2;
  MemoryMapT *__range2;
  PSNode *strong_update;
  PSNode *operand;
  bool changed;
  MemoryMapT *mm;
  MemoryMapT *pmm;
  MemoryObject *in_stack_fffffffffffffe18;
  Pointer *in_stack_fffffffffffffe20;
  PSNode *in_stack_fffffffffffffe28;
  PSNode *in_stack_fffffffffffffe30;
  PSNode *in_stack_fffffffffffffe38;
  Offset in_stack_fffffffffffffe40;
  PSNode *in_stack_fffffffffffffe48;
  Offset local_1b0;
  Pointer in_stack_fffffffffffffe58;
  __node_base in_stack_fffffffffffffe68;
  PSNode *in_stack_fffffffffffffe90;
  MemoryMapT *in_stack_fffffffffffffe98;
  Pointer *in_stack_fffffffffffffea8;
  PointerIdPointsToSet *in_stack_fffffffffffffeb0;
  _Self local_140;
  _Self local_138;
  pointer local_130;
  Offset local_128;
  Pointer local_120;
  Pointer *local_110;
  PSNode *local_d8;
  Offset local_d0 [4];
  Pointer local_b0;
  Pointer *local_a0;
  reference local_98;
  _Self local_90;
  _Self local_88;
  MemoryObject *local_80;
  pointer local_78;
  MemoryObject *local_70;
  reference local_68;
  _Self local_60;
  _Self local_58;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_50;
  PSNode *local_48;
  PSNode *local_40;
  bool local_31;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_30;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_28;
  byte local_19;
  long local_10;
  bool local_1;
  
  local_19 = in_DL & 1;
  local_10 = in_RDI;
  local_28 = SubgraphNode<dg::pta::PSNode>::
             getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8));
  if (local_28 ==
      (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
       *)0x0) {
    local_1 = false;
  }
  else {
    local_30 = SubgraphNode<dg::pta::PSNode>::
               getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                         ((SubgraphNode<dg::pta::PSNode> *)(local_10 + 8));
    local_31 = false;
    local_40 = SubgraphNode<dg::pta::PSNode>::getOperand
                         ((SubgraphNode<dg::pta::PSNode> *)in_stack_fffffffffffffe20,
                          (size_t)in_stack_fffffffffffffe18);
    local_48 = (PSNode *)0x0;
    if (((local_19 & 1) != 0) &&
       (local_48 = moFromFreeToOverwrite(in_stack_fffffffffffffe48), local_48 != (PSNode *)0x0)) {
      bVar1 = overwriteMOFromFree(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      local_31 = (local_31 & 1U) != 0 || bVar1;
    }
    local_50 = local_28;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::begin((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                  *)in_stack_fffffffffffffe18);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::end((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                *)in_stack_fffffffffffffe18);
    while (bVar1 = std::operator!=(&local_58,&local_60), bVar1) {
      local_68 = std::
                 _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                              *)0x171a75);
      bVar1 = isInvalidTarget(local_68->first);
      if ((!bVar1) && (local_48 != local_68->first)) {
        local_70 = getOrCreateMO((MemoryMapT *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        local_78 = std::
                   unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::
                   get((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                        *)0x171ae3);
        local_80 = local_70;
        local_88._M_node = (_Base_ptr)MemoryObject::begin(in_stack_fffffffffffffe18);
        local_90._M_node = (_Base_ptr)MemoryObject::end(in_stack_fffffffffffffe18);
        while (bVar1 = std::operator!=(&local_88,&local_90), bVar1) {
          local_98 = std::
                     _Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                     ::operator*((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                                  *)0x171b50);
          bVar1 = invStrongUpdate(in_stack_fffffffffffffe48);
          if (bVar1) {
            PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_fffffffffffffe20);
            local_b0 = PointerIdPointsToSet::const_iterator::operator*
                                 ((const_iterator *)in_stack_fffffffffffffe18);
            local_a0 = &local_b0;
            bVar1 = Pointer::isUnknown(local_a0);
            if (bVar1) {
              in_stack_fffffffffffffe40.offset = (type)&local_98->second;
              in_stack_fffffffffffffe48 = INVALIDATED;
              Offset::Offset(local_d0,0);
              bVar1 = PointerIdPointsToSet::add
                                ((PointerIdPointsToSet *)in_stack_fffffffffffffe38,
                                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe40);
              local_31 = (local_31 & 1U) != 0 || bVar1;
            }
            else {
              bVar1 = Pointer::isNull(local_a0);
              if (((!bVar1) && (bVar1 = Pointer::isInvalidated(local_a0), !bVar1)) &&
                 (bVar1 = PointerIdPointsToSet::pointsToTarget
                                    ((PointerIdPointsToSet *)in_stack_fffffffffffffe68._M_nxt,
                                     (PSNode *)in_stack_fffffffffffffe58.offset.offset.offset),
                 bVar1)) {
                replaceTargetWithInv(in_stack_fffffffffffffeb0,(PSNode *)in_stack_fffffffffffffea8);
                local_31 = true;
              }
            }
          }
          else {
            local_d8 = local_40 + 0xb0;
            PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_fffffffffffffe20);
            PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_fffffffffffffe20);
            while (bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                                     ((const_iterator *)in_stack_fffffffffffffe20,
                                      (const_iterator *)in_stack_fffffffffffffe18), bVar1) {
              local_120 = PointerIdPointsToSet::const_iterator::operator*
                                    ((const_iterator *)in_stack_fffffffffffffe18);
              local_110 = &local_120;
              bVar1 = Pointer::isNull(local_110);
              if (((!bVar1) && (bVar1 = Pointer::isInvalidated(local_110), !bVar1)) &&
                 ((bVar1 = Pointer::isUnknown(local_110), bVar1 ||
                  (bVar1 = PointerIdPointsToSet::pointsToTarget
                                     ((PointerIdPointsToSet *)in_stack_fffffffffffffe68._M_nxt,
                                      (PSNode *)in_stack_fffffffffffffe58.offset.offset.offset),
                  bVar1)))) {
                in_stack_fffffffffffffe30 = (PSNode *)&local_98->second;
                in_stack_fffffffffffffe38 = INVALIDATED;
                Offset::Offset(&local_128,0);
                bVar1 = PointerIdPointsToSet::add
                                  ((PointerIdPointsToSet *)in_stack_fffffffffffffe38,
                                   in_stack_fffffffffffffe30,in_stack_fffffffffffffe40);
                local_31 = (local_31 & 1U) != 0 || bVar1;
              }
              PointerIdPointsToSet::const_iterator::operator++
                        ((const_iterator *)in_stack_fffffffffffffe30);
            }
          }
          std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
          operator++((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                      *)in_stack_fffffffffffffe20);
        }
        local_130 = local_78;
        local_138._M_node = (_Base_ptr)MemoryObject::begin(in_stack_fffffffffffffe18);
        local_140._M_node = (_Base_ptr)MemoryObject::end(in_stack_fffffffffffffe18);
        while (bVar1 = std::operator!=(&local_138,&local_140), bVar1) {
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
                   operator*((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                              *)0x171e8e);
          in_stack_fffffffffffffeb0 = &ppVar2->second;
          bVar1 = PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x171eb7);
          if (!bVar1) {
            in_stack_fffffffffffffea8 =
                 (Pointer *)
                 std::
                 map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                 ::operator[]((map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                               *)in_stack_fffffffffffffe58.offset.offset.offset,
                              (key_type *)in_stack_fffffffffffffe58.target);
            PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_fffffffffffffe20);
            PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_fffffffffffffe20);
            while (bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                                     ((const_iterator *)in_stack_fffffffffffffe20,
                                      (const_iterator *)in_stack_fffffffffffffe18), bVar1) {
              in_stack_fffffffffffffe58 =
                   PointerIdPointsToSet::const_iterator::operator*
                             ((const_iterator *)in_stack_fffffffffffffe18);
              in_stack_fffffffffffffe68._M_nxt = (_Hash_node_base *)&stack0xfffffffffffffe58;
              bVar1 = Pointer::isValid(in_stack_fffffffffffffe20);
              if ((bVar1) &&
                 (bVar1 = PointerIdPointsToSet::pointsToTarget
                                    ((PointerIdPointsToSet *)in_stack_fffffffffffffe68._M_nxt,
                                     (PSNode *)in_stack_fffffffffffffe58.offset.offset.offset),
                 bVar1)) {
                bVar1 = invStrongUpdate(in_stack_fffffffffffffe48);
                in_stack_fffffffffffffe20 = in_stack_fffffffffffffea8;
                if (!bVar1) {
                  bVar1 = PointerIdPointsToSet::add
                                    ((PointerIdPointsToSet *)in_stack_fffffffffffffe48,
                                     (Pointer *)in_stack_fffffffffffffe40.offset);
                  local_31 = (local_31 & 1U) != 0 || bVar1;
                  in_stack_fffffffffffffe20 = in_stack_fffffffffffffea8;
                }
                in_stack_fffffffffffffe28 = INVALIDATED;
                in_stack_fffffffffffffea8 = in_stack_fffffffffffffe20;
                Offset::Offset(&local_1b0,0);
                bVar1 = PointerIdPointsToSet::add
                                  ((PointerIdPointsToSet *)in_stack_fffffffffffffe38,
                                   in_stack_fffffffffffffe30,in_stack_fffffffffffffe40);
                local_31 = (local_31 & 1U) != 0 || bVar1;
              }
              else {
                bVar1 = PointerIdPointsToSet::add
                                  ((PointerIdPointsToSet *)in_stack_fffffffffffffe48,
                                   (Pointer *)in_stack_fffffffffffffe40.offset);
                local_31 = (local_31 & 1U) != 0 || bVar1;
              }
              PointerIdPointsToSet::const_iterator::operator++
                        ((const_iterator *)in_stack_fffffffffffffe30);
            }
          }
          std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
          operator++((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                      *)in_stack_fffffffffffffe20);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                    *)in_stack_fffffffffffffe20);
    }
    local_1 = (bool)(local_31 & 1);
  }
  return local_1;
}

Assistant:

static bool invalidateMemory(PSNode *node, PSNode *pred,
                                 bool is_free = false) {
        MemoryMapT *pmm = pred->getData<MemoryMapT>();
        if (!pmm) {
            // predecessor was not processed yet
            return false;
        }

        MemoryMapT *mm = node->getData<MemoryMapT>();
        assert(mm && "Node does not have memory map");

        bool changed = false;

        PSNode *operand = node->getOperand(0);
        PSNode *strong_update = nullptr;
        // if we call e.g. free(load p), then the contents of
        // the memory pointed by p will point
        // to invalidated memory (we can do this when we
        // know precisely what is the memory).
        if (is_free) {
            strong_update = moFromFreeToOverwrite(operand);
            if (strong_update)
                changed |= overwriteMOFromFree(mm, strong_update);
        }

        for (auto &I : *pmm) {
            assert(I.first && "nullptr as target");

            if (isInvalidTarget(I.first))
                continue;

            // strong update on this variable?
            if (strong_update == I.first)
                continue;

            // get or create a memory object for this target
            MemoryObject *mo = getOrCreateMO(mm, I.first);
            MemoryObject *pmo = I.second.get();

            // Remove references to invalidated memory from mo
            // if the invalidated object is just one.
            // Otherwise, add the invalidated pointer to the points-to sets
            // (strong vs. weak update) as we do not know which
            // object is actually being invalidated.
            for (auto &it : *mo) {
                if (invStrongUpdate(operand)) { // strong update
                    const auto &ptr = *(operand->pointsTo.begin());
                    if (ptr.isUnknown())
                        changed |= it.second.add(INVALIDATED, 0);
                    else if (ptr.isNull() || ptr.isInvalidated())
                        continue;
                    else if (it.second.pointsToTarget(ptr.target)) {
                        replaceTargetWithInv(it.second, ptr.target);
                        assert(!it.second.pointsToTarget(ptr.target));
                        changed = true;
                    }
                } else { // weak update
                    for (const auto &ptr : operand->pointsTo) {
                        if (ptr.isNull() || ptr.isInvalidated())
                            continue;

                        // invalidate on unknown memory yields invalidate for
                        // each element
                        if (ptr.isUnknown() ||
                            it.second.pointsToTarget(ptr.target)) {
                            changed |= it.second.add(INVALIDATED, 0);
                        }
                    }
                }
            }

            // merge pointers from pmo to mo, but skip
            // the pointers that may point to the freed memory
            for (auto &it : *pmo) {
                PointsToSetT &predS = it.second;
                if (predS.empty()) // keep the map clean
                    continue;

                PointsToSetT &S = mo->pointsTo[it.first];

                // merge pointers from the previous states
                // but do not include the pointers
                // that may point to freed memory.
                // These must be replaced with invalidated.
                for (const auto &ptr : predS) {
                    if (ptr.isValid() && // if the ptr is null or unkown,
                                         // we want to copy it
                        operand->pointsTo.pointsToTarget(ptr.target)) {
                        if (!invStrongUpdate(operand)) {
                            // we still want to copy the original pointer
                            // if we cannot perform strong update
                            // on this invalidated memory
                            changed |= S.add(ptr);
                        }
                        changed |= S.add(INVALIDATED, 0);
                    } else {
                        // this is a pointer to some memory that was not
                        // invalidated, so merge it into the points-to set
                        changed |= S.add(ptr);
                    }
                }

                assert(!S.empty());
            }
        }

        return changed;
    }